

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

void __thiscall
RootIndexProxyModelPrivate::onColumnsMoved
          (RootIndexProxyModelPrivate *this,QModelIndex *sourceParent,int sourceStart,int sourceEnd,
          QModelIndex *destParent,int dest)

{
  QModelIndex childIdx;
  QModelIndex childIdx_00;
  QModelIndex childIdx_01;
  QModelIndex *this_00;
  bool bVar1;
  bool bVar2;
  byte local_c5;
  QModelIndex local_b8;
  undefined8 local_a0;
  quintptr local_98;
  QAbstractItemModel *local_90;
  QModelIndex local_88;
  QPersistentModelIndex local_70;
  undefined8 local_68;
  QAbstractItemModel *local_60;
  QPersistentModelIndex local_58;
  undefined8 local_50;
  QAbstractItemModel *local_48;
  byte local_39;
  RootIndexProxyModel *pRStack_38;
  bool isDescendantRootDestParent;
  RootIndexProxyModel *q;
  QModelIndex *pQStack_28;
  int dest_local;
  QModelIndex *destParent_local;
  int sourceEnd_local;
  int sourceStart_local;
  QModelIndex *sourceParent_local;
  RootIndexProxyModelPrivate *this_local;
  
  q._4_4_ = dest;
  pQStack_28 = destParent;
  destParent_local._0_4_ = sourceEnd;
  destParent_local._4_4_ = sourceStart;
  _sourceEnd_local = sourceParent;
  sourceParent_local = (QModelIndex *)this;
  pRStack_38 = q_func(this);
  bVar1 = ignoreMove(this,_sourceEnd_local,pQStack_28);
  if (!bVar1) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58);
    childIdx.i = local_50;
    childIdx._0_8_ = local_58.d;
    childIdx.m = local_48;
    bVar1 = isDescendant(this,childIdx,pQStack_28);
    local_39 = bVar1;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70);
    childIdx_00.i = local_68;
    childIdx_00._0_8_ = local_70.d;
    childIdx_00.m = local_60;
    bVar2 = isDescendant(this,childIdx_00,_sourceEnd_local);
    this_00 = pQStack_28;
    if (bVar1 == bVar2) {
      if ((local_39 & 1) == 0) {
        QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_88);
        bVar1 = QModelIndex::operator!=(this_00,&local_88);
        local_c5 = 0;
        if (bVar1) {
          local_a0._0_4_ = pQStack_28->r;
          local_a0._4_4_ = pQStack_28->c;
          local_98 = pQStack_28->i;
          local_90 = pQStack_28->m;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)&local_b8);
          childIdx_01.i = local_98;
          childIdx_01.r = (undefined4)local_a0;
          childIdx_01.c = local_a0._4_4_;
          childIdx_01.m = local_90;
          bVar1 = isDescendant(this,childIdx_01,&local_b8);
          local_c5 = bVar1 ^ 0xff;
        }
        if ((local_c5 & 1) == 0) {
          QAbstractItemModel::endMoveColumns();
        }
      }
    }
    else if ((local_39 & 1) == 0) {
      QAbstractItemModel::endInsertColumns();
    }
    else {
      QAbstractItemModel::endRemoveColumns();
    }
  }
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onColumnsMoved(const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destParent,
                                                int dest)
{
    Q_UNUSED(sourceStart)
    Q_UNUSED(sourceEnd)
    Q_UNUSED(dest)
    Q_Q(RootIndexProxyModel);
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == q->sourceModel());
    Q_ASSERT(!destParent.isValid() || destParent.model() == q->sourceModel());
    if (ignoreMove(sourceParent, destParent))
        return;
    const bool isDescendantRootDestParent = isDescendant(m_rootIndex, destParent);
    if (isDescendantRootDestParent == isDescendant(m_rootIndex, sourceParent)) {
        if (isDescendantRootDestParent)
            return;
        if (destParent != m_rootIndex && !isDescendant(destParent, m_rootIndex))
            return;
        q->endMoveColumns();
    } else if (isDescendantRootDestParent)
        q->endRemoveColumns();
    else
        q->endInsertColumns();
}